

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLAttribute * __thiscall tinyxml2::XMLElement::FindAttribute(XMLElement *this,char *name)

{
  long lVar1;
  char *pcVar2;
  XMLAttribute *pXVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  pXVar3 = this->_rootAttribute;
  if (pXVar3 != (XMLAttribute *)0x0) {
    while (pcVar2 = StrPair::GetStr(&pXVar3->_name), pcVar2 != name) {
      bVar5 = *pcVar2 == '\0';
      if ((bVar5) || (*pcVar2 != *name)) {
        bVar6 = false;
        pcVar2 = name;
      }
      else {
        lVar1 = 1;
        do {
          lVar4 = lVar1;
          bVar5 = pcVar2[lVar4] == '\0';
          if ((bVar5) || (pcVar2[lVar4] != name[lVar4])) break;
          lVar1 = lVar4 + 1;
        } while ((int)lVar4 != 0x7fffffff);
        bVar6 = (int)lVar4 == 0x7fffffff;
        pcVar2 = name + lVar4;
      }
      if (bVar6) {
        return pXVar3;
      }
      if ((bVar5) && (*pcVar2 == '\0')) {
        return pXVar3;
      }
      pXVar3 = pXVar3->_next;
      if (pXVar3 == (XMLAttribute *)0x0) {
        return (XMLAttribute *)0x0;
      }
    }
  }
  return pXVar3;
}

Assistant:

const XMLAttribute* XMLElement::FindAttribute( const char* name ) const
{
    for( XMLAttribute* a = _rootAttribute; a; a = a->_next ) {
        if ( XMLUtil::StringEqual( a->Name(), name ) ) {
            return a;
        }
    }
    return 0;
}